

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void TraceBackwards(size_t size,unsigned_short *length_array,unsigned_short **path,size_t *pathsize)

{
  undefined2 uVar1;
  long *plVar2;
  ulong *in_RCX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  long in_RDI;
  unsigned_short temp;
  size_t index;
  void *local_38;
  ulong local_28;
  
  plVar2 = (long *)CONCAT62(in_register_00000012,in_DX);
  local_28 = in_RDI;
  if (in_RDI != 0) {
    do {
      if ((*in_RCX & *in_RCX - 1) == 0) {
        if (*in_RCX == 0) {
          local_38 = malloc(2);
        }
        else {
          local_38 = realloc((void *)*plVar2,*in_RCX << 2);
        }
        *plVar2 = (long)local_38;
      }
      *(undefined2 *)(*plVar2 + *in_RCX * 2) = *(undefined2 *)(in_RSI + local_28 * 2);
      *in_RCX = *in_RCX + 1;
      local_28 = local_28 - *(ushort *)(in_RSI + local_28 * 2);
    } while (local_28 != 0);
    for (local_28 = 0; local_28 < *in_RCX >> 1; local_28 = local_28 + 1) {
      uVar1 = *(undefined2 *)(*plVar2 + local_28 * 2);
      *(undefined2 *)(*plVar2 + local_28 * 2) =
           *(undefined2 *)(*plVar2 + ((*in_RCX - local_28) + -1) * 2);
      *(undefined2 *)(*plVar2 + ((*in_RCX - local_28) + -1) * 2) = uVar1;
    }
  }
  return;
}

Assistant:

static void TraceBackwards(size_t size, const unsigned short* length_array,
                           unsigned short** path, size_t* pathsize) {
  size_t index = size;
  if (size == 0) return;
  for (;;) {
    ZOPFLI_APPEND_DATA(length_array[index], path, pathsize);
    assert(length_array[index] <= index);
    assert(length_array[index] <= ZOPFLI_MAX_MATCH);
    assert(length_array[index] != 0);
    index -= length_array[index];
    if (index == 0) break;
  }

  /* Mirror result. */
  for (index = 0; index < *pathsize / 2; index++) {
    unsigned short temp = (*path)[index];
    (*path)[index] = (*path)[*pathsize - index - 1];
    (*path)[*pathsize - index - 1] = temp;
  }
}